

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O0

rational<short> * __thiscall
tcb::rational<short>::operator-=(rational<short> *this,rational<short> *other)

{
  short sVar1;
  value_type_conflict3 vVar2;
  rational<short> *other_local;
  rational<short> *this_local;
  
  vVar2 = denom(other);
  this->num_ = this->num_ * vVar2;
  sVar1 = this->denom_;
  vVar2 = num(other);
  this->num_ = this->num_ - sVar1 * vVar2;
  vVar2 = denom(other);
  this->denom_ = this->denom_ * vVar2;
  simplify(this);
  return this;
}

Assistant:

TCB_CONSTEXPR14 rational& operator-=(const rational<U>& other)
    {
        num_ *= other.denom();
        num_ -= denom_ * other.num();
        denom_ *= other.denom();
        simplify();
        return *this;
    }